

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O0

int coda_pcre2_substring_list_get_8
              (pcre2_match_data_8 *match_data,PCRE2_UCHAR8 ***listptr,size_t **lengthsptr)

{
  void *pvVar1;
  pcre2_memctl *ppVar2;
  _func_void_ptr_size_t_void_ptr *local_70;
  size_t *ovector;
  PCRE2_UCHAR8 *sp;
  PCRE2_UCHAR8 **listp;
  pcre2_memctl *memp;
  size_t *lensp;
  size_t size;
  uint local_30;
  int count2;
  int count;
  int i;
  size_t **lengthsptr_local;
  PCRE2_UCHAR8 ***listptr_local;
  pcre2_match_data_8 *match_data_local;
  
  local_30 = match_data->rc;
  match_data_local._4_4_ = local_30;
  if (-1 < (int)local_30) {
    if (local_30 == 0) {
      local_30 = (uint)match_data->oveccount;
    }
    lensp = (size_t *)0x20;
    if (lengthsptr != (size_t **)0x0) {
      lensp = (size_t *)((long)(int)local_30 * 8 + 0x20);
    }
    for (count2 = 0; count2 < (int)(local_30 << 1); count2 = count2 + 2) {
      lensp = (size_t *)((long)lensp + 9);
      if (match_data->ovector[count2] < match_data->ovector[count2 + 1]) {
        lensp = (size_t *)
                ((match_data->ovector[count2 + 1] - match_data->ovector[count2]) + (long)lensp);
      }
    }
    pvVar1 = coda__pcre2_memctl_malloc_8((size_t)lensp,&match_data->memctl);
    if (pvVar1 == (void *)0x0) {
      match_data_local._4_4_ = 0xffffffd0;
    }
    else {
      sp = (PCRE2_UCHAR8 *)((long)pvVar1 + 0x18);
      *listptr = (PCRE2_UCHAR8 **)sp;
      ppVar2 = (pcre2_memctl *)((long)sp + (long)(int)(local_30 + 1) * 8);
      if (lengthsptr == (size_t **)0x0) {
        memp = (pcre2_memctl *)0x0;
        ovector = (size_t *)ppVar2;
      }
      else {
        *lengthsptr = (size_t *)ppVar2;
        ovector = (size_t *)(&ppVar2->malloc + (int)local_30);
        memp = ppVar2;
      }
      for (count2 = 0; count2 < (int)(local_30 << 1); count2 = count2 + 2) {
        if (match_data->ovector[count2] < match_data->ovector[count2 + 1]) {
          local_70 = (_func_void_ptr_size_t_void_ptr *)
                     (match_data->ovector[count2 + 1] - match_data->ovector[count2]);
        }
        else {
          local_70 = (_func_void_ptr_size_t_void_ptr *)0x0;
        }
        if (local_70 != (_func_void_ptr_size_t_void_ptr *)0x0) {
          memcpy(ovector,match_data->subject + match_data->ovector[count2],(size_t)local_70);
        }
        *(size_t **)sp = ovector;
        if (memp != (pcre2_memctl *)0x0) {
          memp->malloc = local_70;
          memp = (pcre2_memctl *)&memp->free;
        }
        local_70 = local_70 + (long)ovector;
        ovector = (size_t *)(local_70 + 1);
        *local_70 = (_func_void_ptr_size_t_void_ptr)0x0;
        sp = sp + 8;
      }
      sp[0] = '\0';
      sp[1] = '\0';
      sp[2] = '\0';
      sp[3] = '\0';
      sp[4] = '\0';
      sp[5] = '\0';
      sp[6] = '\0';
      sp[7] = '\0';
      match_data_local._4_4_ = 0;
    }
  }
  return match_data_local._4_4_;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_list_get(pcre2_match_data *match_data, PCRE2_UCHAR ***listptr,
  PCRE2_SIZE **lengthsptr)
{
int i, count, count2;
PCRE2_SIZE size;
PCRE2_SIZE *lensp;
pcre2_memctl *memp;
PCRE2_UCHAR **listp;
PCRE2_UCHAR *sp;
PCRE2_SIZE *ovector;

if ((count = match_data->rc) < 0) return count;   /* Match failed */
if (count == 0) count = match_data->oveccount;    /* Ovector too small */

count2 = 2*count;
ovector = match_data->ovector;
size = sizeof(pcre2_memctl) + sizeof(PCRE2_UCHAR *);      /* For final NULL */
if (lengthsptr != NULL) size += sizeof(PCRE2_SIZE) * count;  /* For lengths */

for (i = 0; i < count2; i += 2)
  {
  size += sizeof(PCRE2_UCHAR *) + CU2BYTES(1);
  if (ovector[i+1] > ovector[i]) size += CU2BYTES(ovector[i+1] - ovector[i]);
  }

memp = PRIV(memctl_malloc)(size, (pcre2_memctl *)match_data);
if (memp == NULL) return PCRE2_ERROR_NOMEMORY;

*listptr = listp = (PCRE2_UCHAR **)((char *)memp + sizeof(pcre2_memctl));
lensp = (PCRE2_SIZE *)((char *)listp + sizeof(PCRE2_UCHAR *) * (count + 1));

if (lengthsptr == NULL)
  {
  sp = (PCRE2_UCHAR *)lensp;
  lensp = NULL;
  }
else
  {
  *lengthsptr = lensp;
  sp = (PCRE2_UCHAR *)((char *)lensp + sizeof(PCRE2_SIZE) * count);
  }

for (i = 0; i < count2; i += 2)
  {
  size = (ovector[i+1] > ovector[i])? (ovector[i+1] - ovector[i]) : 0;

  /* Size == 0 includes the case when the capture is unset. Avoid adding
  PCRE2_UNSET to match_data->subject because it overflows, even though with
  zero size calling memcpy() is harmless. */

  if (size != 0) memcpy(sp, match_data->subject + ovector[i], CU2BYTES(size));
  *listp++ = sp;
  if (lensp != NULL) *lensp++ = size;
  sp += size;
  *sp++ = 0;
  }

*listp = NULL;
return 0;
}